

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

void bcf_hrec_debug(FILE *fp,bcf_hrec_t *hrec)

{
  char *local_38;
  int local_1c;
  int i;
  bcf_hrec_t *hrec_local;
  FILE *fp_local;
  
  if (hrec->value == (char *)0x0) {
    local_38 = "";
  }
  else {
    local_38 = hrec->value;
  }
  fprintf((FILE *)fp,"key=[%s] value=[%s]",hrec->key,local_38);
  for (local_1c = 0; local_1c < hrec->nkeys; local_1c = local_1c + 1) {
    fprintf((FILE *)fp,"\t[%s]=[%s]",hrec->keys[local_1c],hrec->vals[local_1c]);
  }
  fprintf((FILE *)fp,"\n");
  return;
}

Assistant:

void bcf_hrec_debug(FILE *fp, bcf_hrec_t *hrec)
{
    fprintf(fp, "key=[%s] value=[%s]", hrec->key, hrec->value?hrec->value:"");
    int i;
    for (i=0; i<hrec->nkeys; i++)
        fprintf(fp, "\t[%s]=[%s]", hrec->keys[i],hrec->vals[i]);
    fprintf(fp, "\n");
}